

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChArchive.h
# Opt level: O1

string * __thiscall
chrono::ChEnumMapper<chrono::ChLinkLock::LinkType>::GetValueAsString_abi_cxx11_
          (string *__return_storage_ptr__,ChEnumMapper<chrono::ChLinkLock::LinkType> *this)

{
  element_type *peVar1;
  pointer pCVar2;
  uint uVar3;
  pointer pCVar4;
  size_t sVar5;
  ulong uVar6;
  long lVar7;
  pointer pCVar8;
  ulong uVar9;
  bool bVar10;
  char buffer [10];
  char local_22 [10];
  
  peVar1 = (this->enummap).
           super___shared_ptr<std::vector<chrono::ChEnumNamePair<chrono::ChLinkLock::LinkType>,_std::allocator<chrono::ChEnumNamePair<chrono::ChLinkLock::LinkType>_>_>,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  pCVar8 = (peVar1->
           super__Vector_base<chrono::ChEnumNamePair<chrono::ChLinkLock::LinkType>,_std::allocator<chrono::ChEnumNamePair<chrono::ChLinkLock::LinkType>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  lVar7 = (long)(peVar1->
                super__Vector_base<chrono::ChEnumNamePair<chrono::ChLinkLock::LinkType>,_std::allocator<chrono::ChEnumNamePair<chrono::ChLinkLock::LinkType>_>_>
                )._M_impl.super__Vector_impl_data._M_finish - (long)pCVar8;
  bVar10 = lVar7 != 0;
  if (bVar10) {
    uVar6 = (lVar7 >> 3) * -0x3333333333333333;
    if (pCVar8->enumid != *this->value_ptr) {
      uVar9 = 0;
      pCVar4 = pCVar8;
      do {
        if ((uVar6 + (uVar6 == 0)) - 1 == uVar9) goto LAB_0059a910;
        pCVar8 = pCVar4 + 1;
        uVar9 = uVar9 + 1;
        pCVar2 = pCVar4 + 1;
        pCVar4 = pCVar8;
      } while (pCVar2->enumid != *this->value_ptr);
      bVar10 = uVar9 <= uVar6 && uVar6 - uVar9 != 0;
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,*(long *)&pCVar8->name,
               (pCVar8->name)._M_string_length + *(long *)&pCVar8->name);
    if (bVar10) {
      return __return_storage_ptr__;
    }
  }
LAB_0059a910:
  uVar3 = (**(this->super_ChEnumMapperBase)._vptr_ChEnumMapperBase)(this);
  sprintf(local_22,"%d",(ulong)uVar3);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  sVar5 = strlen(local_22);
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,local_22,local_22 + sVar5);
  return __return_storage_ptr__;
}

Assistant:

virtual std::string GetValueAsString() override {
        for (int i = 0; i < enummap->size(); ++i)
        {
            if(enummap->at(i).enumid == *value_ptr)
                return enummap->at(i).name;
        }
        // not found, just string as number:
        char buffer [10];
        sprintf(buffer, "%d", GetValueAsInt());
        return std::string(buffer);
    }